

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_semantic_analysis.cpp
# Opt level: O0

compile_errcode __thiscall SwitchTable::Action(SwitchTable *this,SymbolType *parent_type)

{
  compile_errcode cVar1;
  int local_28;
  int count;
  int ret;
  SymbolType *parent_type_local;
  SwitchTable *this_local;
  
  local_28 = 0;
  while( true ) {
    cVar1 = SwitchChildStatement::Action(&this->m_switch_child_statement,parent_type);
    if (cVar1 != 0) break;
    SwitchChildStatement::LogOutput(&this->m_switch_child_statement);
    local_28 = local_28 + 1;
  }
  if (local_28 < 1) {
    this_local._4_4_ = -1;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

compile_errcode SwitchTable::Action(const SymbolType& parent_type) {
    int ret = 0;
    int count = 0;
    while (true) {
        if ((ret = m_switch_child_statement.Action(parent_type)) == COMPILE_OK) {
            m_switch_child_statement.LogOutput();
            count++;
        } else {
            break;
        }
    }
    if (count > 0)
        return COMPILE_OK;
    else
        return NOT_MATCH;
}